

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O1

void Abc_CexPrintStatsInputs(Abc_Cex_t *p,int nInputs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  if (p == (Abc_Cex_t *)0x0) {
    puts("The counter example is NULL.");
    return;
  }
  if (p != (Abc_Cex_t *)0x1) {
    uVar1 = p->nBits;
    if ((int)uVar1 < 1) {
      iVar3 = 0;
      iVar4 = 0;
    }
    else {
      iVar4 = 0;
      iVar3 = 0;
      uVar5 = 0;
      do {
        iVar3 = iVar3 + (uint)(((uint)(&p[1].iPo)[uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0);
        iVar4 = iVar4 + ((uint)((int)(uVar5 - p->nRegs) % p->nPis < nInputs) &
                        (uint)(&p[1].iPo)[uVar5 >> 5] >> (sbyte)(uVar5 & 0x1f));
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    iVar2 = uVar1 - p->nRegs;
    printf("CEX: Po =%4d  Frame =%4d  FF = %d  PI = %d  Bit =%8d  1s =%8d (%5.2f %%) 1sIn =%8d (%5.2f %%)\n"
           ,((double)iVar3 * 100.0) / (double)iVar2,
           ((double)iVar4 * 100.0) / (double)((nInputs - p->nPis) * (p->iFrame + 1) + iVar2),
           (ulong)(uint)p->iPo);
    return;
  }
  puts("The counter example is present but not available (pointer has value \"1\").");
  return;
}

Assistant:

void Abc_CexPrintStatsInputs( Abc_Cex_t * p, int nInputs )
{
    int k, Counter = 0, Counter2 = 0;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return;
    }
    if ( p == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
    {
        printf( "The counter example is present but not available (pointer has value \"1\").\n" );
        return;
    }
    for ( k = 0; k < p->nBits; k++ )
    {
        Counter += Abc_InfoHasBit(p->pData, k);
        if ( (k - p->nRegs) % p->nPis < nInputs )
            Counter2 += Abc_InfoHasBit(p->pData, k);
    }
    printf( "CEX: Po =%4d  Frame =%4d  FF = %d  PI = %d  Bit =%8d  1s =%8d (%5.2f %%) 1sIn =%8d (%5.2f %%)\n", 
        p->iPo, p->iFrame, p->nRegs, p->nPis, p->nBits, 
        Counter,  100.0 * Counter  / (p->nBits - p->nRegs), 
        Counter2, 100.0 * Counter2 / (p->nBits - p->nRegs - (p->iFrame + 1) * (p->nPis - nInputs)) );
}